

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbenchmarkperfevents.cpp
# Opt level: O2

void __thiscall
QBenchmarkPerfEventsMeasurer::~QBenchmarkPerfEventsMeasurer(QBenchmarkPerfEventsMeasurer *this)

{
  ~QBenchmarkPerfEventsMeasurer(this);
  operator_delete(this,0x20);
  return;
}

Assistant:

QBenchmarkPerfEventsMeasurer::~QBenchmarkPerfEventsMeasurer()
{
    for (int fd : std::as_const(fds))
        qt_safe_close(fd);
}